

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O3

void PDHG_Update_Average(CUPDLPwork *work)

{
  CUPDLPiterates *pCVar1;
  CUPDLPdata *pCVar2;
  CUPDLPstepsize *pCVar3;
  CUPDLPvec *pCVar4;
  CUPDLPvec *pCVar5;
  int iVar6;
  cupdlp_float dMeanStepSize;
  double local_38;
  
  pCVar1 = work->iterates;
  pCVar2 = work->problem->data;
  pCVar3 = work->stepsize;
  iVar6 = work->timers->nIter;
  iVar6 = (iVar6 - ((iVar6 - (iVar6 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  pCVar4 = pCVar1->x[iVar6];
  local_38 = pCVar3->dPrimalStep * pCVar3->dDualStep;
  pCVar5 = pCVar1->y[iVar6];
  if (local_38 < 0.0) {
    local_38 = sqrt(local_38);
  }
  else {
    local_38 = SQRT(local_38);
  }
  cupdlp_axpy(work,pCVar2->nCols,&local_38,pCVar4->data,pCVar1->xSum);
  cupdlp_axpy(work,pCVar2->nRows,&local_38,pCVar5->data,pCVar1->ySum);
  pCVar3->dSumPrimalStep = local_38 + pCVar3->dSumPrimalStep;
  pCVar3->dSumDualStep = local_38 + pCVar3->dSumDualStep;
  return;
}

Assistant:

void PDHG_Update_Average(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];

  // PDLP weighs average iterates in this way
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);
  // AddToVector(iterates->xSum, dMeanStepSize, xUpdate, lp->nCols);
  // AddToVector(iterates->ySum, dMeanStepSize, yUpdate, lp->nRows);
  cupdlp_axpy(work, lp->nCols, &dMeanStepSize, xUpdate->data, iterates->xSum);
  cupdlp_axpy(work, lp->nRows, &dMeanStepSize, yUpdate->data, iterates->ySum);

  stepsize->dSumPrimalStep += dMeanStepSize;
  stepsize->dSumDualStep += dMeanStepSize;
}